

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.c
# Opt level: O3

mk_iov * mk_iov_create(int n,int offset)

{
  mk_iov *pmVar1;
  
  pmVar1 = (mk_iov *)calloc(1,(long)(n * 0x18 + 0x28));
  if (pmVar1 != (mk_iov *)0x0) {
    pmVar1->io = (iovec *)(pmVar1 + 1);
    pmVar1->buf_to_free = (void **)((long)&pmVar1[1].iov_idx + (long)(n * 0x10));
    pmVar1->iov_idx = offset;
    pmVar1->size = n;
  }
  return pmVar1;
}

Assistant:

struct mk_iov *mk_iov_create(int n, int offset)
{
    int s_all;
    int s_iovec;
    int s_free_buf;
    void *p;
    struct mk_iov *iov;

    s_all      = sizeof(struct mk_iov);       /* main mk_iov structure */
    s_iovec    = (n * sizeof(struct mk_iovec));  /* iovec array size      */
    s_free_buf = (n * sizeof(void *));        /* free buf array        */

    p = mk_mem_alloc_z(s_all + s_iovec + s_free_buf);
    if (!p) {
        return NULL;
    }

    /* Set pointer address */
    iov     = p;
    iov->io = (struct mk_iovec *)((uint8_t *)p + sizeof(struct mk_iov));
    iov->buf_to_free = (void *) ((uint8_t*)p + sizeof(struct mk_iov) + s_iovec);

    mk_iov_init(iov, n, offset);
    return iov;
}